

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::PlasticMaterial::PlasticMaterial(PlasticMaterial *this,string *name)

{
  string *in_RDI;
  Material *in_stack_ffffffffffffffe0;
  
  Material::Material(in_stack_ffffffffffffffe0,in_RDI);
  *(undefined ***)in_RDI = &PTR_toString_abi_cxx11__002205a0;
  math::vec3f::vec3f((vec3f *)((long)&in_RDI[1].field_2 + 8),0.25);
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x144517);
  math::vec3f::vec3f((vec3f *)((long)&in_RDI[2].field_2 + 8),0.25);
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x14453d);
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x14454b);
  *(undefined4 *)&in_RDI[4]._M_string_length = 0x3dcccccd;
  std::shared_ptr<pbrt::Texture>::shared_ptr((shared_ptr<pbrt::Texture> *)0x14456c);
  in_RDI[5]._M_dataplus = (_Alloc_hider)0x1;
  return;
}

Assistant:

PlasticMaterial(const std::string &name = "") : Material(name) {}